

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS
ref_inflate_rate(REF_INT nlayers,REF_DBL first_thickness,REF_DBL total_thickness,REF_DBL *rate)

{
  int iVar1;
  bool bVar2;
  double __x;
  double dVar3;
  REF_DBL dHdr;
  double local_38;
  undefined8 uStack_30;
  
  __x = 1.1;
  bVar2 = true;
  iVar1 = 100;
  while( true ) {
    if (!bVar2) {
      *rate = __x;
      return 0;
    }
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    dVar3 = pow(__x,(double)nlayers);
    local_38 = ((1.0 - dVar3) * first_thickness) / (1.0 - __x) - total_thickness;
    uStack_30 = 0;
    ref_inflate_dthickness(nlayers,first_thickness,__x,&dHdr);
    __x = __x - local_38 / dHdr;
    dVar3 = local_38 / total_thickness;
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    bVar2 = 1e-12 < dVar3;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x3fd,
         "ref_inflate_rate","iteration count exceeded");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_rate(REF_INT nlayers, REF_DBL first_thickness,
                                    REF_DBL total_thickness, REF_DBL *rate) {
  REF_DBL r, H, err, dHdr;
  REF_BOOL keep_going;
  REF_INT iters;
  r = 1.1;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    iters++;
    if (iters > 100) THROW("iteration count exceeded");

    RSS(ref_inflate_total_thickness(nlayers, first_thickness, r, &H), "total");
    err = H - total_thickness;

    RSS(ref_inflate_dthickness(nlayers, first_thickness, r, &dHdr), "total");

    /* printf(" r %e H %e err %e dHdr %e\n",r,H,err,dHdr); */

    r = r - err / dHdr;

    keep_going = (ABS(err / total_thickness) > 1.0e-12);
  }

  *rate = r;

  return REF_SUCCESS;
}